

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void SerializeMany<ParamsStream<AutoFile&,TransactionSerParams>,prevector<28u,unsigned_char,unsigned_int,int>>
               (ParamsStream<AutoFile_&,_TransactionSerParams> *s,
               prevector<28U,_unsigned_char,_unsigned_int,_int> *args)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  long in_FS_OFFSET;
  
  sVar2 = *(size_t *)(in_FS_OFFSET + 0x28);
  uVar1 = args->_size;
  uVar3 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
  }
  WriteCompactSize<ParamsStream<AutoFile&,TransactionSerParams>>(s,(ulong)uVar3);
  uVar1 = args->_size;
  uVar3 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
  }
  if (uVar3 == 0) {
    if (*(size_t *)(in_FS_OFFSET + 0x28) == sVar2) {
      return;
    }
  }
  else {
    if (0x1c < uVar1) {
      args = *(prevector<28U,_unsigned_char,_unsigned_int,_int> **)&args->_union;
    }
    if (*(size_t *)(in_FS_OFFSET + 0x28) == sVar2) {
      AutoFile::write(s->m_substream,(int)args,(void *)(ulong)uVar3,*(size_t *)(in_FS_OFFSET + 0x28)
                     );
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}